

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void * op_url_stream_vcreate_impl
                 (OpusFileCallbacks *_cb,char *_url,OpusServerInfo *_info,OpusServerInfo **_pinfo,
                 __va_list_tag *_ap)

{
  long lVar1;
  void *pvVar2;
  char *_proxy_host;
  uint _skip_certificate_check;
  long *plVar3;
  int *piVar4;
  char *_proxy_user;
  uint _proxy_port;
  uint *puVar5;
  uint uVar6;
  OpusServerInfo *pOVar7;
  undefined8 *puVar8;
  char *_proxy_pass;
  
  *_pinfo = (OpusServerInfo *)0x0;
  uVar6 = _ap->gp_offset;
  _proxy_port = 0x1f90;
  _proxy_host = (char *)0x0;
  _proxy_user = (char *)0x0;
  _proxy_pass = (char *)0x0;
  pOVar7 = (OpusServerInfo *)0x0;
  _skip_certificate_check = 0;
  while( true ) {
    if (uVar6 < 0x29) {
      plVar3 = (long *)((ulong)uVar6 + (long)_ap->reg_save_area);
      uVar6 = uVar6 + 8;
      _ap->gp_offset = uVar6;
    }
    else {
      plVar3 = (long *)_ap->overflow_arg_area;
      _ap->overflow_arg_area = plVar3 + 1;
    }
    lVar1 = *plVar3;
    if (lVar1 == 0) break;
    if (lVar1 - 0x1940U == 0) {
      if (uVar6 < 0x29) {
        piVar4 = (int *)((ulong)uVar6 + (long)_ap->reg_save_area);
        uVar6 = uVar6 + 8;
        _ap->gp_offset = uVar6;
      }
      else {
        piVar4 = (int *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = piVar4 + 2;
      }
      _skip_certificate_check = (uint)(*piVar4 != 0);
    }
    else {
      switch(lVar1 << 0x3a | lVar1 - 0x1940U >> 6) {
      case 1:
        if (uVar6 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar6 + (long)_ap->reg_save_area);
          uVar6 = uVar6 + 8;
          _ap->gp_offset = uVar6;
        }
        else {
          puVar8 = (undefined8 *)_ap->overflow_arg_area;
          _ap->overflow_arg_area = puVar8 + 1;
        }
        _proxy_host = (char *)*puVar8;
        break;
      case 2:
        if (uVar6 < 0x29) {
          puVar5 = (uint *)((ulong)uVar6 + (long)_ap->reg_save_area);
          uVar6 = uVar6 + 8;
          _ap->gp_offset = uVar6;
        }
        else {
          puVar5 = (uint *)_ap->overflow_arg_area;
          _ap->overflow_arg_area = puVar5 + 2;
        }
        _proxy_port = *puVar5;
        if (0xffff < _proxy_port) {
          return (void *)0x0;
        }
        break;
      case 3:
        if (uVar6 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar6 + (long)_ap->reg_save_area);
          uVar6 = uVar6 + 8;
          _ap->gp_offset = uVar6;
        }
        else {
          puVar8 = (undefined8 *)_ap->overflow_arg_area;
          _ap->overflow_arg_area = puVar8 + 1;
        }
        _proxy_user = (char *)*puVar8;
        break;
      case 4:
        if (uVar6 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar6 + (long)_ap->reg_save_area);
          uVar6 = uVar6 + 8;
          _ap->gp_offset = uVar6;
        }
        else {
          puVar8 = (undefined8 *)_ap->overflow_arg_area;
          _ap->overflow_arg_area = puVar8 + 1;
        }
        _proxy_pass = (char *)*puVar8;
        break;
      case 5:
        if (uVar6 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar6 + (long)_ap->reg_save_area);
          uVar6 = uVar6 + 8;
          _ap->gp_offset = uVar6;
        }
        else {
          puVar8 = (undefined8 *)_ap->overflow_arg_area;
          _ap->overflow_arg_area = puVar8 + 1;
        }
        pOVar7 = (OpusServerInfo *)*puVar8;
        break;
      default:
        goto LAB_0010d535;
      }
    }
  }
  if (pOVar7 == (OpusServerInfo *)0x0) {
    pvVar2 = op_url_stream_create_impl
                       (_cb,_url,_skip_certificate_check,_proxy_host,_proxy_port,_proxy_user,
                        _proxy_pass,(OpusServerInfo *)0x0);
    return pvVar2;
  }
  _info->server = (char *)0x0;
  _info->content_type = (char *)0x0;
  _info->genre = (char *)0x0;
  _info->url = (char *)0x0;
  _info->name = (char *)0x0;
  _info->description = (char *)0x0;
  _info->bitrate_kbps = -1;
  _info->is_public = -1;
  _info->is_ssl = 0;
  pvVar2 = op_url_stream_create_impl
                     (_cb,_url,_skip_certificate_check,_proxy_host,_proxy_port,_proxy_user,
                      _proxy_pass,_info);
  if (pvVar2 != (void *)0x0) {
    *_pinfo = pOVar7;
    return pvVar2;
  }
  opus_server_info_clear(_info);
LAB_0010d535:
  return (void *)0x0;
}

Assistant:

static void *op_url_stream_vcreate_impl(OpusFileCallbacks *_cb,
 const char *_url,OpusServerInfo *_info,OpusServerInfo **_pinfo,va_list _ap){
  int             skip_certificate_check;
  const char     *proxy_host;
  opus_int32      proxy_port;
  const char     *proxy_user;
  const char     *proxy_pass;
  OpusServerInfo *pinfo;
  skip_certificate_check=0;
  proxy_host=NULL;
  proxy_port=8080;
  proxy_user=NULL;
  proxy_pass=NULL;
  pinfo=NULL;
  *_pinfo=NULL;
  for(;;){
    ptrdiff_t request;
    request=va_arg(_ap,char *)-(char *)NULL;
    /*If we hit NULL, we're done processing options.*/
    if(!request)break;
    switch(request){
      case OP_SSL_SKIP_CERTIFICATE_CHECK_REQUEST:{
        skip_certificate_check=!!va_arg(_ap,opus_int32);
      }break;
      case OP_HTTP_PROXY_HOST_REQUEST:{
        proxy_host=va_arg(_ap,const char *);
      }break;
      case OP_HTTP_PROXY_PORT_REQUEST:{
        proxy_port=va_arg(_ap,opus_int32);
        if(proxy_port<0||proxy_port>(opus_int32)65535)return NULL;
      }break;
      case OP_HTTP_PROXY_USER_REQUEST:{
        proxy_user=va_arg(_ap,const char *);
      }break;
      case OP_HTTP_PROXY_PASS_REQUEST:{
        proxy_pass=va_arg(_ap,const char *);
      }break;
      case OP_GET_SERVER_INFO_REQUEST:{
        pinfo=va_arg(_ap,OpusServerInfo *);
      }break;
      /*Some unknown option.*/
      default:return NULL;
    }
  }
  /*If the caller has requested server information, proxy it to a local copy to
     simplify error handling.*/
  if(pinfo!=NULL){
    void *ret;
    opus_server_info_init(_info);
    ret=op_url_stream_create_impl(_cb,_url,skip_certificate_check,
     proxy_host,proxy_port,proxy_user,proxy_pass,_info);
    if(ret!=NULL)*_pinfo=pinfo;
    else opus_server_info_clear(_info);
    return ret;
  }
  return op_url_stream_create_impl(_cb,_url,skip_certificate_check,
   proxy_host,proxy_port,proxy_user,proxy_pass,NULL);
}